

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec3 __thiscall djb::tab_r::u2_to_h2_std_radial(tab_r *this,vec2 *u,float_t zi,float_t param_3)

{
  float_t qf1;
  float_t fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float __x;
  vec3 vVar5;
  
  qf1 = tab_r::qf1(this,u->x,zi);
  fVar1 = qf2(this,u->y,qf1,zi);
  __x = (qf1 + qf1 + -1.0) * 3.1415927;
  fVar2 = fVar1 * fVar1 * 3.1415927 * 0.5;
  fVar3 = sinf(fVar2);
  fVar4 = cosf(__x);
  vVar5.x = fVar4 * fVar3;
  fVar4 = sinf(__x);
  fVar2 = cosf(fVar2);
  vVar5.y = fVar4 * fVar3;
  vVar5.z = fVar2;
  return vVar5;
}

Assistant:

vec3 tab_r::u2_to_h2_std_radial(const vec2 &u, float_t zi, float_t) const
{
	float_t u1 = qf1(u.x, zi);
	float_t u2 = qf2(u.y, u1, zi);
	float_t pm = (2 * u1 - 1) * m_pi();
	float_t tm = sqr(u2) * m_pi() / 2;
	float_t z_m = sin(tm);

	return vec3(z_m * cos(pm), z_m * sin(pm), cos(tm));
}